

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::adoptTimeZone(Calendar *this,TimeZone *zone)

{
  TimeZone *zone_local;
  Calendar *this_local;
  
  if (zone != (TimeZone *)0x0) {
    if (this->fZone != (TimeZone *)0x0) {
      (*(this->fZone->super_UObject)._vptr_UObject[1])();
    }
    this->fZone = zone;
    this->fAreFieldsSet = '\0';
  }
  return;
}

Assistant:

void
Calendar::adoptTimeZone(TimeZone* zone)
{
    // Do nothing if passed-in zone is NULL
    if (zone == NULL) return;

    // fZone should always be non-null
    delete fZone;
    fZone = zone;

    // if the zone changes, we need to recompute the time fields
    fAreFieldsSet = FALSE;
}